

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  int iVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  U32 UVar12;
  U32 UVar13;
  uint uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  long lVar20;
  size_t sVar21;
  BYTE *dst;
  BYTE *pBVar22;
  BYTE *pBVar23;
  ulong uVar24;
  bool bVar25;
  BYTE *local_6e0;
  BYTE *local_6d0;
  BYTE *local_690;
  BYTE *local_678;
  BYTE *local_668;
  BYTE *local_660;
  U32 local_64c;
  U32 local_648;
  uint local_5d8;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  size_t mLength_1;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  size_t rLength_1;
  BYTE *repMatchEnd;
  BYTE *repMatch_1;
  BYTE *repBase;
  U32 repIndex;
  U32 curr_1;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t h;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *dictBase;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  size_t local_478;
  size_t local_460;
  size_t local_448;
  size_t local_430;
  U32 tmpOff;
  size_t rLength;
  size_t step;
  U32 offcode;
  BYTE *match1;
  BYTE *match0;
  BYTE *repMatch;
  U32 matchIndex1;
  U32 matchIndex0;
  U32 current1;
  U32 current0;
  U32 val1;
  size_t h1;
  U32 val0;
  size_t h0;
  BYTE *ip2;
  size_t mLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 offsetSaved;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  U32 prefixStartIndex_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart_1;
  BYTE *base_1;
  size_t stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_2f0;
  size_t local_2d8;
  size_t local_2c0;
  size_t local_2a8;
  size_t local_290;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  
  pUVar5 = ms->hashTable;
  UVar1 = (ms->cParams).hashLog;
  uVar2 = (ms->cParams).targetLength;
  uVar3 = (ms->cParams).targetLength;
  pBVar6 = (ms->window).base;
  pBVar19 = (ms->window).dictBase;
  iVar7 = (int)pBVar6;
  UVar8 = ZSTD_getLowestMatchIndex(ms,((int)src - iVar7) + (int)srcSize,(ms->cParams).windowLog);
  local_5d8 = (ms->window).dictLimit;
  if (local_5d8 < UVar8) {
    local_5d8 = UVar8;
  }
  pBVar15 = pBVar6 + local_5d8;
  pBVar16 = pBVar19 + local_5d8;
  pBVar17 = (BYTE *)((long)src + srcSize);
  pBVar18 = pBVar17 + -8;
  h._4_4_ = *rep;
  h._0_4_ = rep[1];
  _lowLimit = (BYTE *)src;
  anchor = (BYTE *)src;
  if (local_5d8 == UVar8) {
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar6 = (ms->window).base;
    iVar7 = (int)pBVar6;
    UVar8 = ZSTD_getLowestPrefixIndex(ms,((int)src - iVar7) + (int)srcSize,(ms->cParams).windowLog);
    pBVar19 = (BYTE *)((long)src + srcSize);
    pBVar15 = pBVar19 + -8;
    uVar4 = *rep;
    uVar14 = rep[1];
    windowLow = 0;
    ip1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar6 + UVar8));
    anchor_1 = ip1 + 1;
    UVar9 = (int)ip1 - iVar7;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,UVar9,(ms->cParams).windowLog);
    uVar11 = UVar9 - UVar10;
    curr = uVar14;
    if (uVar11 < uVar14) {
      curr = 0;
      windowLow = uVar14;
    }
    offsetSaved = uVar4;
    _prefixStartIndex_1 = (BYTE *)src;
    if (uVar11 < uVar4) {
      offsetSaved = 0;
      windowLow = uVar4;
    }
    while (anchor_1 < pBVar15) {
      pBVar16 = ip1 + 2;
      switch(mls) {
      default:
        local_290 = ZSTD_hash4Ptr(ip1,UVar1);
        break;
      case 5:
        local_290 = ZSTD_hash5Ptr(ip1,UVar1);
        break;
      case 6:
        local_290 = ZSTD_hash6Ptr(ip1,UVar1);
        break;
      case 7:
        local_290 = ZSTD_hash7Ptr(ip1,UVar1);
        break;
      case 8:
        local_290 = ZSTD_hash8Ptr(ip1,UVar1);
      }
      UVar9 = MEM_read32(ip1);
      switch(mls) {
      default:
        local_2a8 = ZSTD_hash4Ptr(anchor_1,UVar1);
        break;
      case 5:
        local_2a8 = ZSTD_hash5Ptr(anchor_1,UVar1);
        break;
      case 6:
        local_2a8 = ZSTD_hash6Ptr(anchor_1,UVar1);
        break;
      case 7:
        local_2a8 = ZSTD_hash7Ptr(anchor_1,UVar1);
        break;
      case 8:
        local_2a8 = ZSTD_hash8Ptr(anchor_1,UVar1);
      }
      UVar10 = MEM_read32(anchor_1);
      uVar11 = (int)ip1 - iVar7;
      uVar4 = pUVar5[local_290];
      uVar14 = pUVar5[local_2a8];
      pBVar17 = pBVar16 + -(ulong)offsetSaved;
      match1 = pBVar6 + uVar4;
      pUVar5[local_290] = uVar11;
      pUVar5[local_2a8] = (int)anchor_1 - iVar7;
      UVar12 = MEM_read32(pBVar17);
      UVar13 = MEM_read32(pBVar16);
      if (offsetSaved == 0 || UVar12 != UVar13) {
        if ((UVar8 < uVar4) && (UVar12 = MEM_read32(match1), UVar12 == UVar9)) {
LAB_00c66029:
          curr = offsetSaved;
          offsetSaved = (int)ip1 - (int)match1;
          step._4_4_ = offsetSaved + 2;
          ip2 = (BYTE *)0x4;
          while( true ) {
            bVar25 = false;
            if (_prefixStartIndex_1 < ip1 && pBVar6 + UVar8 < match1) {
              bVar25 = ip1[-1] == match1[-1];
            }
            if (!bVar25) break;
            ip1 = ip1 + -1;
            match1 = match1 + -1;
            ip2 = ip2 + 1;
          }
          goto LAB_00c6610b;
        }
        if ((UVar8 < uVar14) && (UVar9 = MEM_read32(pBVar6 + uVar14), UVar9 == UVar10)) {
          ip1 = anchor_1;
          match1 = pBVar6 + uVar14;
          goto LAB_00c66029;
        }
        lVar20 = ((ulong)((long)ip1 - (long)_prefixStartIndex_1) >> 7) +
                 (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
        ip1 = ip1 + lVar20;
        anchor_1 = anchor_1 + lVar20;
      }
      else {
        lVar20 = (long)(int)(uint)(ip1[1] == pBVar17[-1]);
        ip1 = pBVar16 + -lVar20;
        match1 = pBVar17 + -lVar20;
        ip2 = (BYTE *)(lVar20 + 4);
        step._4_4_ = 0;
LAB_00c6610b:
        sVar21 = ZSTD_count(ip1 + (long)ip2,match1 + (long)ip2,pBVar19);
        pBVar16 = ip2 + sVar21;
        uVar24 = (long)ip1 - (long)_prefixStartIndex_1;
        if (pBVar19 + -0x20 < _prefixStartIndex_1 + uVar24) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixStartIndex_1,_prefixStartIndex_1 + uVar24,pBVar19 + -0x20)
          ;
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixStartIndex_1);
          if (0x10 < uVar24) {
            pBVar17 = seqStore->lit;
            pBVar18 = pBVar17 + 0x10;
            ZSTD_copy16(pBVar18,_prefixStartIndex_1 + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend = pBVar17 + 0x20;
              do {
                op = _prefixStartIndex_1 + 0x20;
                ZSTD_copy16(oend,op);
                ZSTD_copy16(oend + 0x10,_prefixStartIndex_1 + 0x30);
                oend = oend + 0x20;
                _prefixStartIndex_1 = op;
              } while (oend < pBVar18 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offset = step._4_4_ + 1;
        if ((BYTE *)0xffff < pBVar16 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(pBVar16 + -3);
        seqStore->sequences = seqStore->sequences + 1;
        ip1 = pBVar16 + (long)ip1;
        if (ip1 <= pBVar15) {
          pBVar16 = pBVar6 + (ulong)uVar11 + 2;
          switch(mls) {
          default:
            local_2c0 = ZSTD_hash4Ptr(pBVar16,UVar1);
            break;
          case 5:
            local_2c0 = ZSTD_hash5Ptr(pBVar16,UVar1);
            break;
          case 6:
            local_2c0 = ZSTD_hash6Ptr(pBVar16,UVar1);
            break;
          case 7:
            local_2c0 = ZSTD_hash7Ptr(pBVar16,UVar1);
            break;
          case 8:
            local_2c0 = ZSTD_hash8Ptr(pBVar16,UVar1);
          }
          pUVar5[local_2c0] = uVar11 + 2;
          pBVar16 = ip1 + -2;
          switch(mls) {
          default:
            local_2d8 = ZSTD_hash4Ptr(pBVar16,UVar1);
            break;
          case 5:
            local_2d8 = ZSTD_hash5Ptr(pBVar16,UVar1);
            break;
          case 6:
            local_2d8 = ZSTD_hash6Ptr(pBVar16,UVar1);
            break;
          case 7:
            local_2d8 = ZSTD_hash7Ptr(pBVar16,UVar1);
            break;
          case 8:
            local_2d8 = ZSTD_hash8Ptr(pBVar16,UVar1);
          }
          pUVar5[local_2d8] = (int)pBVar16 - iVar7;
          if (curr != 0) {
            while( true ) {
              UVar9 = curr;
              bVar25 = false;
              if (ip1 <= pBVar15) {
                UVar10 = MEM_read32(ip1);
                UVar12 = MEM_read32(ip1 + -(ulong)curr);
                bVar25 = UVar10 == UVar12;
              }
              if (!bVar25) break;
              sVar21 = ZSTD_count(ip1 + 4,ip1 + 4 + -(ulong)curr,pBVar19);
              curr = offsetSaved;
              offsetSaved = UVar9;
              switch(mls) {
              default:
                local_2f0 = ZSTD_hash4Ptr(ip1,UVar1);
                break;
              case 5:
                local_2f0 = ZSTD_hash5Ptr(ip1,UVar1);
                break;
              case 6:
                local_2f0 = ZSTD_hash6Ptr(ip1,UVar1);
                break;
              case 7:
                local_2f0 = ZSTD_hash7Ptr(ip1,UVar1);
                break;
              case 8:
                local_2f0 = ZSTD_hash8Ptr(ip1,UVar1);
              }
              pUVar5[local_2f0] = (int)ip1 - iVar7;
              if (pBVar19 + -0x20 < ip1) {
                ZSTD_safecopyLiterals(seqStore->lit,ip1,ip1,pBVar19 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,ip1);
              }
              seqStore->lit = seqStore->lit;
              seqStore->sequences->litLength = 0;
              seqStore->sequences->offset = 1;
              if (0xffff < sVar21 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(sVar21 + 1);
              seqStore->sequences = seqStore->sequences + 1;
              ip1 = ip1 + sVar21 + 4;
            }
          }
        }
        anchor_1 = ip1 + 1;
        _prefixStartIndex_1 = ip1;
      }
    }
    if (offsetSaved == 0) {
      local_648 = windowLow;
    }
    else {
      local_648 = offsetSaved;
    }
    *rep = local_648;
    if (curr == 0) {
      local_64c = windowLow;
    }
    else {
      local_64c = curr;
    }
    rep[1] = local_64c;
    ms_local = (ZSTD_matchState_t *)(pBVar19 + -(long)_prefixStartIndex_1);
  }
  else {
LAB_00c66c51:
    if (anchor < pBVar18) {
      switch(mls) {
      default:
        local_430 = ZSTD_hash4Ptr(anchor,UVar1);
        break;
      case 5:
        local_430 = ZSTD_hash5Ptr(anchor,UVar1);
        break;
      case 6:
        local_430 = ZSTD_hash6Ptr(anchor,UVar1);
        break;
      case 7:
        local_430 = ZSTD_hash7Ptr(anchor,UVar1);
        break;
      case 8:
        local_430 = ZSTD_hash8Ptr(anchor,UVar1);
      }
      uVar4 = pUVar5[local_430];
      local_660 = pBVar6;
      if (uVar4 < local_5d8) {
        local_660 = pBVar19;
      }
      _repIndex = local_660 + uVar4;
      uVar14 = (int)anchor - iVar7;
      uVar11 = (uVar14 + 1) - h._4_4_;
      local_668 = pBVar6;
      if (uVar11 < local_5d8) {
        local_668 = pBVar19;
      }
      pUVar5[local_430] = uVar14;
      if ((local_5d8 - 1) - uVar11 < 3 || (uVar14 + 1) - UVar8 <= h._4_4_) {
LAB_00c6730a:
        if (UVar8 <= uVar4) {
          UVar9 = MEM_read32(_repIndex);
          UVar10 = MEM_read32(anchor);
          if (UVar9 == UVar10) {
            local_690 = pBVar15;
            pBVar23 = pBVar17;
            if (uVar4 < local_5d8) {
              local_690 = pBVar19 + UVar8;
              pBVar23 = pBVar16;
            }
            sVar21 = ZSTD_count_2segments(anchor + 4,_repIndex + 4,pBVar17,pBVar23,pBVar15);
            _repIndex2 = sVar21 + 4;
            while( true ) {
              bVar25 = false;
              if (_lowLimit < anchor && local_690 < _repIndex) {
                bVar25 = anchor[-1] == _repIndex[-1];
              }
              if (!bVar25) break;
              anchor = anchor + -1;
              _repIndex = _repIndex + -1;
              _repIndex2 = _repIndex2 + 1;
            }
            h._0_4_ = h._4_4_;
            uVar24 = (long)anchor - (long)_lowLimit;
            if (pBVar17 + -0x20 < _lowLimit + uVar24) {
              ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit + uVar24,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowLimit);
              if (0x10 < uVar24) {
                pBVar23 = seqStore->lit;
                pBVar22 = pBVar23 + 0x10;
                ZSTD_copy16(pBVar22,_lowLimit + 0x10);
                if (0x10 < (long)(uVar24 - 0x10)) {
                  oend_3 = pBVar23 + 0x20;
                  do {
                    op_3 = _lowLimit + 0x20;
                    ZSTD_copy16(oend_3,op_3);
                    ZSTD_copy16(oend_3 + 0x10,_lowLimit + 0x30);
                    oend_3 = oend_3 + 0x20;
                    _lowLimit = op_3;
                  } while (oend_3 < pBVar22 + (uVar24 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar24;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar24;
            seqStore->sequences->offset = (uVar14 - uVar4) + 3;
            if (0xffff < _repIndex2 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(_repIndex2 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            anchor = anchor + _repIndex2;
            h._4_4_ = uVar14 - uVar4;
            goto LAB_00c678ad;
          }
        }
        anchor = anchor + ((long)anchor - (long)_lowLimit >> 8) +
                          (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1));
      }
      else {
        UVar9 = MEM_read32(local_668 + uVar11);
        UVar10 = MEM_read32(anchor + 1);
        if (UVar9 != UVar10) goto LAB_00c6730a;
        local_678 = pBVar17;
        if (uVar11 < local_5d8) {
          local_678 = pBVar16;
        }
        sVar21 = ZSTD_count_2segments(anchor + 5,local_668 + uVar11 + 4,pBVar17,local_678,pBVar15);
        pBVar23 = anchor + (1 - (long)_lowLimit);
        if (pBVar17 + -0x20 < _lowLimit + (long)pBVar23) {
          ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit + (long)pBVar23,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowLimit);
          if ((BYTE *)0x10 < pBVar23) {
            pBVar22 = seqStore->lit;
            dst = pBVar22 + 0x10;
            ZSTD_copy16(dst,_lowLimit + 0x10);
            if (0x10 < (long)(pBVar23 + -0x10)) {
              oend_2 = pBVar22 + 0x20;
              do {
                op_2 = _lowLimit + 0x20;
                ZSTD_copy16(oend_2,op_2);
                ZSTD_copy16(oend_2 + 0x10,_lowLimit + 0x30);
                oend_2 = oend_2 + 0x20;
                _lowLimit = op_2;
              } while (oend_2 < dst + (long)(pBVar23 + -0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + (long)pBVar23;
        if ((BYTE *)0xffff < pBVar23) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)pBVar23;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
        anchor = anchor + sVar21 + 5;
LAB_00c678ad:
        _lowLimit = anchor;
        if (anchor <= pBVar18) {
          pBVar23 = pBVar6 + (ulong)uVar14 + 2;
          switch(mls) {
          default:
            local_448 = ZSTD_hash4Ptr(pBVar23,UVar1);
            break;
          case 5:
            local_448 = ZSTD_hash5Ptr(pBVar23,UVar1);
            break;
          case 6:
            local_448 = ZSTD_hash6Ptr(pBVar23,UVar1);
            break;
          case 7:
            local_448 = ZSTD_hash7Ptr(pBVar23,UVar1);
            break;
          case 8:
            local_448 = ZSTD_hash8Ptr(pBVar23,UVar1);
          }
          pUVar5[local_448] = uVar14 + 2;
          pBVar23 = anchor + -2;
          switch(mls) {
          default:
            local_460 = ZSTD_hash4Ptr(pBVar23,UVar1);
            break;
          case 5:
            local_460 = ZSTD_hash5Ptr(pBVar23,UVar1);
            break;
          case 6:
            local_460 = ZSTD_hash6Ptr(pBVar23,UVar1);
            break;
          case 7:
            local_460 = ZSTD_hash7Ptr(pBVar23,UVar1);
            break;
          case 8:
            local_460 = ZSTD_hash8Ptr(pBVar23,UVar1);
          }
          pUVar5[local_460] = (int)pBVar23 - iVar7;
          for (; uVar4 = (U32)h, _lowLimit = anchor, anchor <= pBVar18; anchor = anchor + sVar21 + 4
              ) {
            UVar9 = (int)anchor - iVar7;
            uVar11 = UVar9 - (U32)h;
            if (uVar11 < local_5d8) {
              local_6d0 = pBVar19 + uVar11;
            }
            else {
              local_6d0 = pBVar6 + uVar11;
            }
            if ((local_5d8 - 1) - uVar11 < 3 || uVar14 - UVar8 <= (U32)h) break;
            UVar10 = MEM_read32(local_6d0);
            UVar12 = MEM_read32(anchor);
            if (UVar10 != UVar12) break;
            local_6e0 = pBVar17;
            if (uVar11 < local_5d8) {
              local_6e0 = pBVar16;
            }
            sVar21 = ZSTD_count_2segments(anchor + 4,local_6d0 + 4,pBVar17,local_6e0,pBVar15);
            h._0_4_ = h._4_4_;
            h._4_4_ = uVar4;
            if (pBVar17 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_4._0_2_ = (U16)(sVar21 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_4;
            seqStore->sequences = seqStore->sequences + 1;
            switch(mls) {
            default:
              local_478 = ZSTD_hash4Ptr(anchor,UVar1);
              break;
            case 5:
              local_478 = ZSTD_hash5Ptr(anchor,UVar1);
              break;
            case 6:
              local_478 = ZSTD_hash6Ptr(anchor,UVar1);
              break;
            case 7:
              local_478 = ZSTD_hash7Ptr(anchor,UVar1);
              break;
            case 8:
              local_478 = ZSTD_hash8Ptr(anchor,UVar1);
            }
            pUVar5[local_478] = UVar9;
          }
        }
      }
      goto LAB_00c66c51;
    }
    *rep = h._4_4_;
    rep[1] = (U32)h;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_lowLimit);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    curr = (U32)(ip-base);
        const U32    repIndex = curr + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = curr;   /* update hash table */
        DEBUGLOG(7, "offset_1 = %u , curr = %u", offset_1, curr);

        if ( ( ((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */
             & (offset_1 < curr+1 - dictStartIndex) ) /* note: we are searching at curr+1 */
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = curr - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+curr+2, hlog, mls)] = curr+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 < curr - dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}